

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Cluster.c
# Opt level: O2

void Llb_ManClusterOne(Llb_Mtr_t *p,int iCol1,int iCol2)

{
  Llb_Grp_t *pLVar1;
  
  pLVar1 = Llb_ManGroupsCombine(p->pColGrps[iCol1],p->pColGrps[iCol2]);
  Llb_MtrCombineSelectedColumns(p,iCol1,iCol2);
  p->pColGrps[iCol1] = pLVar1;
  p->pColGrps[iCol2] = (Llb_Grp_t *)0x0;
  return;
}

Assistant:

void Llb_ManClusterOne( Llb_Mtr_t * p, int iCol1, int iCol2 )
{
    int fVerbose = 0;
    Llb_Grp_t * pGrp;
    int iVar;

    if ( fVerbose )
    {
        printf( "Combining %d and %d\n", iCol1, iCol2 );
        for ( iVar = 0; iVar < p->nRows; iVar++ )
        {
            if ( p->pMatrix[iCol1][iVar] == 0 && p->pMatrix[iCol2][iVar] == 0 )
                continue;
            printf( "%3d : %c%c\n", iVar, 
                p->pMatrix[iCol1][iVar]? '*':' ', 
                p->pMatrix[iCol2][iVar]? '*':' ' );
        }
    }
    pGrp = Llb_ManGroupsCombine( p->pColGrps[iCol1], p->pColGrps[iCol2] );
    Llb_MtrCombineSelectedColumns( p, iCol1, iCol2 );
    p->pColGrps[iCol1] = pGrp;
    p->pColGrps[iCol2] = NULL;
}